

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cc
# Opt level: O0

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall assembler::Assembler::process(Assembler *this,VCDU *vcdu)

{
  bool bVar1;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_VirtualChannel>_>::value,_pair<iterator,_bool>_>
  _Var2;
  VCDU *in_stack_00000010;
  VirtualChannel *in_stack_00000018;
  iterator it;
  int vcid;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  out;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  VirtualChannel *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  _Rb_tree_iterator<std::pair<const_int,_assembler::VirtualChannel>_> in_stack_fffffffffffffe70;
  _Self local_58;
  _Self local_50;
  undefined4 local_48;
  int local_34;
  
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::vector((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
            *)0x2d86a6);
  local_34 = VCDU::getVCID((VCDU *)0x2d86b3);
  if (local_34 == 0x3f) {
    std::
    vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ::vector((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)in_stack_fffffffffffffe60,
             (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  else {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
         ::find((map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                (key_type *)0x2d871b);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
         ::end((map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    bVar1 = std::operator==(&local_50,&local_58);
    if (bVar1) {
      VirtualChannel::VirtualChannel(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      std::make_pair<int&,assembler::VirtualChannel>
                ((int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      _Var2 = std::
              map<int,assembler::VirtualChannel,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
              ::insert<std::pair<int,assembler::VirtualChannel>>
                        ((map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                          *)in_stack_fffffffffffffe70._M_node,
                         (pair<int,_assembler::VirtualChannel> *)
                         CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe70 = _Var2.first._M_node;
      std::pair<int,_assembler::VirtualChannel>::~pair
                ((pair<int,_assembler::VirtualChannel> *)0x2d87d4);
      VirtualChannel::~VirtualChannel(in_stack_fffffffffffffe60);
    }
    std::
    map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
    ::find((map<int,_assembler::VirtualChannel,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),(key_type *)0x2d8835);
    std::_Rb_tree_iterator<std::pair<const_int,_assembler::VirtualChannel>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_assembler::VirtualChannel>_> *)0x2d8850);
    VirtualChannel::process(in_stack_00000018,in_stack_00000010);
  }
  local_48 = 1;
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::~vector((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
             *)in_stack_fffffffffffffe70._M_node);
  return in_RDI;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> Assembler::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;

  // Ignore fill packets
  auto vcid = vcdu.getVCID();
  if (vcid == 63) {
    return out;
  }

  // Create virtual channel instance if it does not yet exist
  if (vcs_.find(vcid) == vcs_.end()) {
    vcs_.insert(std::make_pair(vcid, VirtualChannel(vcid)));
  }

  // Let virtual channel process VCDU
  auto it = vcs_.find(vcid);
  return it->second.process(vcdu);
}